

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver2Q1L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  double *this;
  double *this_00;
  double *this_01;
  double *this_02;
  double *this_03;
  double *this_04;
  double *this_05;
  double dVar1;
  uint uVar2;
  size_type sVar3;
  ostream *this_06;
  reference pvVar4;
  reference pvVar5;
  Scalar *pSVar6;
  reference pvVar7;
  Scalar *pSVar8;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar9;
  double dVar10;
  double dVar11;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> PVar12;
  XprTypeNested local_1478;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1470;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1460;
  value_type local_1448;
  Scalar local_13c8;
  Scalar local_13c0;
  Scalar local_13b8;
  Scalar local_13b0;
  Scalar local_13a8;
  Scalar local_13a0;
  Scalar local_1398;
  Scalar local_1390;
  Scalar local_1388;
  Scalar local_1380;
  double local_1378;
  double local_1370;
  Scalar local_1368;
  Scalar local_1360;
  double local_1358;
  double local_1350;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1348;
  XprTypeNested local_1328;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1320;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1310;
  value_type local_12f8;
  Scalar local_1270;
  Scalar local_1268;
  Scalar local_1260;
  Scalar local_1258;
  Scalar local_1250;
  Scalar local_1248;
  Scalar local_1240;
  Scalar local_1238;
  Scalar local_1230;
  Scalar local_1228;
  double local_1220;
  double local_1218;
  Scalar local_1210;
  Scalar local_1208;
  double local_1200;
  double local_11f8;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_11f0;
  double local_11d0;
  double s2;
  double s1;
  double c;
  double b;
  double a;
  double l26;
  double l25;
  double l24;
  double l23;
  double l22;
  double l21;
  double l16;
  double l15;
  double l14;
  double l13;
  double l12;
  double l11;
  Matrix<double,_4,_4,_0,_4,_4> TF2;
  Matrix<double,_4,_4,_0,_4,_4> TF1;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1038;
  undefined1 local_1028 [8];
  Matrix<double,_6,_1,_0,_6,_1> L2_2;
  Matrix<double,_6,_1,_0,_6,_1> L1_2;
  Type local_f90;
  ColXpr local_f58;
  Type local_f28;
  Matrix<double,_3,_1,_0,_3,_1> local_ec8;
  Matrix<double,_3,_3,_0,_3,_3> local_eb0;
  int local_e64;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_e60;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_e38;
  Type local_dd8;
  Type local_da0;
  Type local_d68;
  Type local_d30;
  Type local_cf8;
  Type local_cc0;
  ColXpr local_c88;
  Type local_c58;
  Matrix<double,_3,_1,_0,_3,_1> local_bf8;
  Matrix<double,_3,_3,_0,_3,_3> local_be0;
  int local_b94;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_b90;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_b68;
  Type local_b08;
  Type local_ad0;
  Type local_a98;
  Type local_a60;
  undefined1 local_a28 [8];
  Matrix<double,_6,_6,_0,_6,_6> transLineV;
  Matrix<double,_6,_6,_0,_6,_6> transLineU;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  Matrix<double,_4,_1,_0,_4,_1> local_6c8;
  Matrix<double,_4,_1,_0,_4,_1> local_6a8;
  Matrix<double,_4,_1,_0,_4,_1> local_688;
  undefined1 local_668 [8];
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  RealScalar local_618;
  Type local_610;
  type local_5d8;
  Type local_5c0;
  undefined1 local_588 [8];
  Matrix<double,_6,_1,_0,_6,_1> L2;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_550;
  Matrix<double,3,1,0,3,1> local_538 [8];
  Matrix<double,_3,_1,_0,_3,_1> D2;
  RealScalar local_4e8;
  Type local_4e0;
  type local_4a8;
  Type local_490;
  undefined1 local_458 [8];
  Matrix<double,_6,_1,_0,_6,_1> L1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_420;
  Matrix<double,3,1,0,3,1> local_408 [8];
  Matrix<double,_3,_1,_0,_3,_1> D1;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_3b8;
  Type local_360;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_328;
  Type local_2d0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_298;
  Type local_240;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_208;
  undefined1 local_1b0 [8];
  Matrix<double,_3,_1,_0,_3,_1> tQ2;
  Matrix<double,_3,_1,_0,_3,_1> tQ1;
  Matrix<double,_3,_1,_0,_3,_1> tP2;
  undefined1 local_158 [8];
  Matrix<double,_3,_1,_0,_3,_1> tP1;
  undefined1 local_138 [8];
  Matrix<double,_4,_1,_0,_4,_1> R2_B;
  Matrix<double,_4,_1,_0,_4,_1> R1_B;
  Matrix<double,_4,_1,_0,_4,_1> Q2;
  Matrix<double,_4,_1,_0,_4,_1> Q1;
  Matrix<double,_4,_1,_0,_4,_1> P2_B;
  Matrix<double,_4,_1,_0,_4,_1> P2;
  Matrix<double,_4,_1,_0,_4,_1> P1_B;
  Matrix<double,_4,_1,_0,_4,_1> P1;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar3 = std::
          vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
          ::size(ptPair);
  if (1 < sVar3) {
    sVar3 = std::
            vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            ::size(lPair);
    if (sVar3 != 0) {
      this = P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
             array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this);
      this_00 = P2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_00);
      this_01 = P2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_01);
      this_02 = Q1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_02);
      this_03 = Q2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_03);
      this_04 = R1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_04);
      this_05 = R2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_05);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_138);
      pvVar4 = std::
               vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
               ::operator[](ptPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this,&pvVar4->first);
      pvVar4 = std::
               vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
               ::operator[](ptPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_00,&pvVar4->second);
      pvVar4 = std::
               vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
               ::operator[](ptPair,1);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_01,&pvVar4->first);
      pvVar4 = std::
               vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
               ::operator[](ptPair,1);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_02,&pvVar4->second);
      pvVar5 = std::
               vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_03,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar5);
      pvVar5 = std::
               vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_04,&(pvVar5->first).second);
      pvVar5 = std::
               vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)this_05,&(pvVar5->second).first);
      pvVar5 = std::
               vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               ::operator[](lPair,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                ((Matrix<double,_4,_1,_0,_4,_1> *)local_138,&(pvVar5->second).second);
      tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
      _7_1_ = 0;
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::vector(__return_storage_ptr__);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_158);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 (tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2));
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_1b0);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_240,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (Q2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3),3);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                          (P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_208,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_240,
                 pSVar6);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)local_158,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_208);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_2d0,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 3),3);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                          (P2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_298,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_2d0,
                 pSVar6);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_298);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                (&local_360,
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 (R2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 3),3);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                          (Q2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                           .m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_328,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)&local_360,
                 pSVar6);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_328);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
                ((Type *)(D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2),
                 (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_138,3);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                          (R1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
                (&local_3b8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)
                 (D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2),pSVar6);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)local_1b0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                  *)&local_3b8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (&local_420,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_158);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (local_408,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_420);
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_458);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_490,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_458,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_490,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_408);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_4a8,
                 (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 (tQ1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_158);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_4e0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_458,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_4e0,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_4a8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)(D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2),
                 (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_458,3);
      local_4e8 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                  norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)(D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                           .m_data.array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_458,&local_4e8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (&local_550,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1b0,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2));
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                (local_538,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_550);
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_588);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                (&local_5c0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_588,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_5c0,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_538);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (&local_5d8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1b0,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (tQ2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
                (&local_610,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_588,3);
      Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> *)&local_610,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_5d8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
                ((Type *)&predTrans.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_588,3);
      local_618 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
                  norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&predTrans.
                           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_588,&local_618);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                (&local_688,
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (P1_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 3));
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                (&local_6a8,
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (P2_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                  .array + 3));
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                (&local_6c8,
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (P2.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3));
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                ((Matrix<double,_4,_1,_0,_4,_1> *)
                 (TV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (Q1.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3));
      getPredefinedTransformations2Points1Line<double>
                ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  *)local_668,&local_688,&local_6a8,&local_6c8,
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 (TV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf));
      pvVar7 = std::
               vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                       *)local_668);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<double,_4,_4,_0,_4,_4> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),pvVar7);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  *)local_668);
      pvVar7 = std::
               vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                       *)local_668);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<double,_4,_4,_0,_4,_4> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),pvVar7);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  *)local_668);
      Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix
                ((Matrix<double,_6,_6,_0,_6,_6> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23));
      Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)local_a28);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23));
      Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)local_a28);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_a60,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_a98,
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_a98,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_a60);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_ad0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
                (&local_b08,
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_b08,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_ad0);
      local_b94 = -1;
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
                (&local_c88,
                 (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                (&local_c58,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                 &local_c88,3);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
                ((Matrix<double,3,1,0,3,1> *)&local_bf8,
                 (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                  *)&local_c58);
      getSkew<double>(&local_be0,&local_bf8);
      Eigen::operator*(&local_b90,&local_b94,(StorageBaseType *)&local_be0);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_cc0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
      ::operator*(&local_b68,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                   *)&local_b90,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_cc0);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
                (&local_cf8,
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                 (transLineV.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                  m_data.array + 0x23),3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_cf8,
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_b68);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_d30,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
                (&local_d68,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_a28,3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_d68,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_d30);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_da0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
                (&local_dd8,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_a28,3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_dd8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                 &local_da0);
      local_e64 = -1;
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
                (&local_f58,
                 (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
                (&local_f28,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
                 &local_f58,3);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
                ((Matrix<double,3,1,0,3,1> *)&local_ec8,
                 (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                  *)&local_f28);
      getSkew<double>(&local_eb0,&local_ec8);
      Eigen::operator*(&local_e60,&local_e64,(StorageBaseType *)&local_eb0);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_f90,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),3,3);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
      ::operator*(&local_e38,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                   *)&local_e60,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_f90);
      Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
                ((Type *)(L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array + 5),
                 (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_a28,3,3);
      Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)
                 (L1_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                  *)&local_e38);
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5));
      Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_1028);
      local_1038 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                              (transLineV.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + 0x23),
                              (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_458);
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)
                 (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                  .array + 5),
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&local_1038);
      PVar12 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_a28,
                          (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_588);
      TF1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
           (double)PVar12.m_lhs;
      Eigen::Matrix<double,6,1,0,6,1>::operator=
                ((Matrix<double,6,1,0,6,1> *)local_1028,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)(TF1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array + 0xf));
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
                ((Matrix<double,_4,_4,_0,_4,_4> *)
                 (TF2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf));
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)&l11);
      Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
                ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                 (TF2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array + 0xf),4,4);
      Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
                ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&l11,4,4);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                          (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array + 5),0);
      l12 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                          (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array + 5),1);
      l13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                          (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array + 5),2);
      l14 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                          (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array + 5),3);
      l15 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                          (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array + 5),4);
      l16 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
                          (L2_2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array + 5),5);
      l21 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1028,0);
      l22 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1028,1);
      l23 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1028,2);
      l24 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1028,3);
      l25 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1028,4);
      l26 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_1028,5);
      a = *pSVar8;
      b = l21 * l24 + ((((l14 * a - l15 * l22) - l13 * l26) - l16 * l23) - l12 * l25);
      c = ((l15 + l15) * l23 + ((l12 + l12) * l26 - (l13 + l13) * l25)) - (l16 + l16) * l22;
      s1 = l21 * l24 + l16 * l23 + l15 * l22 + l14 * a + l12 * l25 + l13 * l26;
      dVar11 = -c;
      dVar10 = sqrt(c * c - b * 4.0 * s1);
      dVar1 = c;
      s2 = (dVar11 - dVar10) / (b + b);
      dVar10 = sqrt(c * c - b * 4.0 * s1);
      local_11d0 = (dVar10 - dVar1) / (b + b);
      uVar2 = std::isnan(s2);
      if ((uVar2 & 1) == 0) {
        local_11f8 = (1.0 - s2 * s2) / (s2 * s2 + 1.0);
        Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator<<
                  (&local_11f0,
                   (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                   (TF2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array + 0xf),&local_11f8);
        local_1200 = (s2 * -2.0) / (s2 * s2 + 1.0);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (&local_11f0,&local_1200);
        local_1208 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1208);
        local_1210 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1210);
        local_1218 = (s2 + s2) / (s2 * s2 + 1.0);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1218);
        local_1220 = (1.0 - s2 * s2) / (s2 * s2 + 1.0);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1220);
        local_1228 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1228);
        local_1230 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1230);
        local_1238 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1238);
        local_1240 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1240);
        local_1248 = 1.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1248);
        local_1250 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1250);
        local_1258 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1258);
        local_1260 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1260);
        local_1268 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1268);
        local_1270 = 1.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                  (pCVar9,&local_1270);
        Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer
                  (&local_11f0);
        local_1328 = (XprTypeNested)
                     Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                               ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array + 0xf));
        local_1320 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                               ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)
                                &local_1328,
                                (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                (TF2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array + 0xf));
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
        ::operator*(&local_1310,
                    (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                     *)&local_1320,
                    (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                    (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array + 0x23));
        Eigen::Matrix<double,4,4,0,4,4>::
        Matrix<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                  ((Matrix<double,4,4,0,4,4> *)&local_12f8,
                   (EigenBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                    *)&local_1310);
        std::
        vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        ::push_back(__return_storage_ptr__,&local_12f8);
        local_1350 = (1.0 - local_11d0 * local_11d0) / (local_11d0 * local_11d0 + 1.0);
        Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator<<
                  (&local_1348,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&l11,&local_1350)
        ;
        local_1358 = (local_11d0 * -2.0) / (local_11d0 * local_11d0 + 1.0);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (&local_1348,&local_1358);
        local_1360 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1360);
        local_1368 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1368);
        local_1370 = (local_11d0 + local_11d0) / (local_11d0 * local_11d0 + 1.0);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1370);
        local_1378 = (1.0 - local_11d0 * local_11d0) / (local_11d0 * local_11d0 + 1.0);
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1378);
        local_1380 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1380);
        local_1388 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1388);
        local_1390 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1390);
        local_1398 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_1398);
        local_13a0 = 1.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_13a0);
        local_13a8 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_13a8);
        local_13b0 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_13b0);
        local_13b8 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_13b8);
        local_13c0 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                           (pCVar9,&local_13c0);
        local_13c8 = 1.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                  (pCVar9,&local_13c8);
        Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer
                  (&local_1348);
        local_1478 = (XprTypeNested)
                     Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                               ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                (TU.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array + 0xf));
        local_1470 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                               ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)
                                &local_1478,
                                (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&l11);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
        ::operator*(&local_1460,
                    (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                     *)&local_1470,
                    (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                    (transLineU.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                     m_storage.m_data.array + 0x23));
        Eigen::Matrix<double,4,4,0,4,4>::
        Matrix<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                  ((Matrix<double,4,4,0,4,4> *)&local_1448,
                   (EigenBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                    *)&local_1460);
        std::
        vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        ::push_back(__return_storage_ptr__,&local_1448);
      }
      tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
      _7_1_ = 1;
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::~vector((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                 *)local_668);
      if ((tP1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2]._7_1_ & 1) == 0) {
        std::
        vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        ::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  }
  this_06 = std::operator<<((ostream *)&std::cerr,
                            "Solver 2Q 1L requires at least 2 point and 1 line pairs!");
  std::ostream::operator<<(this_06,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver2Q1L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 2 || lPair.size() < 1){
		std::cerr << "Solver 2Q 1L requires at least 2 point and 1 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec,4,1> P1,P1_B,P2,P2_B,Q1,Q2,R1_B,R2_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;
	P2 = ptPair[1].first; P2_B = ptPair[1].second;

	Q1 = lPair[0].first.first; Q2 = lPair[0].first.second;
	R1_B = lPair[0].second.first; R2_B = lPair[0].second.second;

	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP1, tP2, tQ1, tQ2;
	tP1 = Q1.head(3) / P1(3);
	tP2 = Q2.head(3) / P2(3);
	tQ1 = R1_B.head(3) / Q1(3);
	tQ2 = R2_B.head(3) / Q2(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3,1> D1 = tP2 - tP1;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP2.cross(tP1);
	L1 /= L1.head(3).norm();
	// starting from line 2
	Matrix<floatPrec, 3,1> D2 = tQ2 - tQ1;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tQ2.cross(tQ1);
	L2 /= L2.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations2Points1Line<floatPrec>(P1, P2, P1_B, P2_B);
	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_2, L2_2;
	L1_2 = transLineU * L1;
	L2_2 = transLineV * L2;

	// compute rotation around Z axis
	// initialize two transformation solutions
	Matrix<floatPrec, 4,4> TF1, TF2;
	TF1.setIdentity(4,4);
	TF2.setIdentity(4,4);

	// compute polynomial coefficients
	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26;
	l11 = L1_2[0];
	l12 = L1_2[1];
	l13 = L1_2[2];
	l14 = L1_2[3];
	l15 = L1_2[4];
	l16 = L1_2[5];
	l21 = L2_2[0];
	l22 = L2_2[1];
	l23 = L2_2[2];
	l24 = L2_2[3];
	l25 = L2_2[4];
	l26 = L2_2[5];
	floatPrec a, b, c;
	a = l13 * l26 - l14 * l21 - l12 * l25 - l15 * l22 - l11 * l24 + l16 * l23;
	b = 2 * l11 * l25 - 2 * l12 * l24 + 2 * l14 * l22 - 2 * l15 * l21;
	c = l11 * l24 + l12 * l25 + l13 * l26 + l14 * l21 + l15 * l22 + l16 * l23;

	// apply quadratic formula
	floatPrec s1, s2;
	s1 = (-b - sqrt(b * b - 4 * a * c)) / (2 * a);
	s2 = (-b + sqrt(b * b - 4 * a * c)) / (2 * a);

	if(!isnan(s1)){
		TF1 << (1 - s1 * s1) / (1 + s1 * s1), -2 * s1 / (1 + s1 * s1), 0, 0,
			2 * s1 / (1 + s1 * s1), (1 - s1 * s1) / (1 + s1 * s1), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF1 * TU);
		TF2 << (1 - s2 * s2) / (1 + s2 * s2), -2 * s2 / (1 + s2 * s2), 0, 0,
			2 * s2 / (1 + s2 * s2), (1 - s2 * s2) / (1 + s2 * s2), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF2 * TU);
	}

	return out;
}